

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O2

QPixmap * __thiscall
PixmapEntry::pixmap(QPixmap *__return_storage_ptr__,PixmapEntry *this,QSize *size,Mode mode,
                   State state,qreal scale)

{
  QPixmap *this_00;
  qreal scaleFactor;
  bool bVar1;
  QSize QVar2;
  unsigned_long_long uVar3;
  QGuiApplication *pQVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_a8;
  QSize local_90;
  QPalette local_88;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_short>_>
  local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->basePixmap;
  bVar1 = QPixmap::isNull(this_00);
  if (bVar1) {
    QPixmap::load(this_00,&(this->super_QIconLoaderEngineEntry).filename,(char *)0x0,
                  (ImageConversionFlags)0x0);
  }
  local_78.a.a.a.a.a.a.m_size = (qsizetype)operator*(size,scale);
  QVar2 = QPixmap::size(this_00);
  local_90 = QPixmapIconEngine::adjustSize((QSize *)&local_78,QVar2);
  scaleFactor = QIconPrivate::pixmapDevicePixelRatio(scale,size,&local_90);
  local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  uVar3 = QPixmap::cacheKey(this_00);
  QGuiApplication::palette();
  local_78.a.a.a.b.val = QPalette::cacheKey(&local_88);
  local_78.a.a.a.a.a.a.m_size = 10;
  local_78.a.a.a.a.a.a.m_data = "$qt_theme_";
  local_78.a.a.a.a.b.val = (uchar)mode;
  local_78.a.a.b.val = local_90.wd.m_i;
  local_78.a.b.val = local_90.ht.m_i;
  local_78.b.val =
       (unsigned_short)
       (int)((double)((ulong)(scaleFactor * 1000.0) & 0x8000000000000000 | (ulong)DAT_005c3780) +
            scaleFactor * 1000.0);
  local_78.a.a.a.a.a.b.val = uVar3;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_short>_>
  ::convertTo<QString>((QString *)&local_a8,&local_78);
  QPalette::~QPalette(&local_88);
  (__return_storage_ptr__->data).d.ptr = (QPlatformPixmap *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_QPaintDevice)._vptr_QPaintDevice =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->super_QPaintDevice).painters = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap(__return_storage_ptr__);
  bVar1 = QPixmapCache::find((QString *)&local_a8,__return_storage_ptr__);
  if (!bVar1) {
    QVar2 = QPixmap::size(this_00);
    if ((local_90.wd.m_i == QVar2.wd.m_i.m_i) && (local_90.ht.m_i == QVar2.ht.m_i.m_i)) {
      QPixmap::operator=(__return_storage_ptr__,this_00);
    }
    else {
      QPixmap::scaled((QPixmap *)&local_78,this_00,&local_90,IgnoreAspectRatio,SmoothTransformation)
      ;
      QPixmap::operator=(__return_storage_ptr__,(QPixmap *)&local_78);
      QPixmap::~QPixmap((QPixmap *)&local_78);
    }
    pQVar4 = QtPrivate::qobject_cast_helper<QGuiApplication*,QObject>(QCoreApplication::self);
    if (pQVar4 != (QGuiApplication *)0x0) {
      (**(code **)(**(long **)&pQVar4->field_0x8 + 0x70))
                (&local_78,*(long **)&pQVar4->field_0x8,mode,__return_storage_ptr__);
      QPixmap::operator=(__return_storage_ptr__,(QPixmap *)&local_78);
      QPixmap::~QPixmap((QPixmap *)&local_78);
    }
    QPixmap::setDevicePixelRatio(__return_storage_ptr__,scaleFactor);
    QPixmapCache::insert((QString *)&local_a8,__return_storage_ptr__);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap PixmapEntry::pixmap(const QSize &size, QIcon::Mode mode, QIcon::State state, qreal scale)
{
    Q_UNUSED(state);

    // Ensure that basePixmap is lazily initialized before generating the
    // key, otherwise the cache key is not unique
    if (basePixmap.isNull())
        basePixmap.load(filename);

    // If the size of the best match we have (basePixmap) is larger than the
    // requested size, we downscale it to match.
    const auto actualSize = QPixmapIconEngine::adjustSize(size * scale, basePixmap.size());
    const auto calculatedDpr = QIconPrivate::pixmapDevicePixelRatio(scale, size, actualSize);
    QString key = "$qt_theme_"_L1
                  % HexString<quint64>(basePixmap.cacheKey())
                  % HexString<quint8>(mode)
                  % HexString<quint64>(QGuiApplication::palette().cacheKey())
                  % HexString<uint>(actualSize.width())
                  % HexString<uint>(actualSize.height())
                  % HexString<quint16>(qRound(calculatedDpr * 1000));

    QPixmap cachedPixmap;
    if (QPixmapCache::find(key, &cachedPixmap)) {
        return cachedPixmap;
    } else {
        if (basePixmap.size() != actualSize)
            cachedPixmap = basePixmap.scaled(actualSize, Qt::IgnoreAspectRatio, Qt::SmoothTransformation);
        else
            cachedPixmap = basePixmap;
        if (QGuiApplication *guiApp = qobject_cast<QGuiApplication *>(qApp))
            cachedPixmap = static_cast<QGuiApplicationPrivate*>(QObjectPrivate::get(guiApp))->applyQIconStyleHelper(mode, cachedPixmap);
        cachedPixmap.setDevicePixelRatio(calculatedDpr);
        QPixmapCache::insert(key, cachedPixmap);
    }
    return cachedPixmap;
}